

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_io.h
# Opt level: O0

uchar * append_uint32(uchar *cp,uint32_t i)

{
  uint local_1c;
  uint32_t j;
  uint32_t i_local;
  uchar *cp_local;
  
  if (i == 0) {
    *cp = '0';
    return cp + 1;
  }
  if (i < 100) {
LAB_00161fb2:
    if (i / 10 == 0) {
      _j = cp;
      if (i != 0) {
        _j = cp + 1;
        *cp = (char)i + '0';
      }
      return _j;
    }
    *cp = (char)(i / 10) + '0';
    local_1c._0_1_ = (char)(i % 10);
    _j = cp + 1;
    goto LAB_001621a4;
  }
  if (i < 10000) {
LAB_00161f31:
    if (i / 1000 != 0) {
      *cp = (char)(i / 1000) + '0';
      local_1c = i % 1000;
      _j = cp + 1;
      goto LAB_00162142;
    }
    if (i / 100 == 0) goto LAB_00161fb2;
    _j = cp + 1;
    *cp = (char)(i / 100) + '0';
    local_1c = i % 100;
  }
  else {
    if (i < 1000000) {
LAB_00161ead:
      if (i / 100000 != 0) {
        *cp = (char)(i / 100000) + '0';
        local_1c = i % 100000;
        _j = cp + 1;
        goto LAB_001620e0;
      }
      if (i / 10000 == 0) goto LAB_00161f31;
      _j = cp + 1;
      *cp = (char)(i / 10000) + '0';
      local_1c = i % 10000;
    }
    else {
      if (i < 100000000) {
LAB_00161e29:
        if (i / 10000000 != 0) {
          *cp = (char)(i / 10000000) + '0';
          local_1c = i % 10000000;
          _j = cp + 1;
          goto LAB_0016207e;
        }
        if (i / 1000000 == 0) goto LAB_00161ead;
        _j = cp + 1;
        *cp = (char)(i / 1000000) + '0';
        local_1c = i % 1000000;
      }
      else {
        if (i / 1000000000 == 0) {
          if (i / 100000000 == 0) goto LAB_00161e29;
          _j = cp + 1;
          *cp = (char)(i / 100000000) + '0';
          local_1c = i % 100000000;
        }
        else {
          *cp = (char)(i / 1000000000) + '0';
          _j = cp + 2;
          cp[1] = (char)((ulong)(i % 1000000000) / 100000000) + '0';
          local_1c = (i % 1000000000) % 100000000;
        }
        *_j = (char)((ulong)local_1c / 10000000) + '0';
        local_1c = local_1c % 10000000;
        _j = _j + 1;
LAB_0016207e:
        *_j = (char)((ulong)local_1c / 1000000) + '0';
        local_1c = local_1c % 1000000;
        _j = _j + 1;
      }
      *_j = (char)((ulong)local_1c / 100000) + '0';
      local_1c = local_1c % 100000;
      _j = _j + 1;
LAB_001620e0:
      *_j = (char)((ulong)local_1c / 10000) + '0';
      local_1c = local_1c % 10000;
      _j = _j + 1;
    }
    *_j = (char)((ulong)local_1c / 1000) + '0';
    local_1c = local_1c % 1000;
    _j = _j + 1;
LAB_00162142:
    *_j = (char)((ulong)local_1c / 100) + '0';
    local_1c = local_1c % 100;
    _j = _j + 1;
  }
  *_j = (char)((ulong)local_1c / 10) + '0';
  local_1c._0_1_ = (char)(local_1c % 10);
  _j = _j + 1;
LAB_001621a4:
  *_j = (char)local_1c + '0';
  return _j + 1;
}

Assistant:

static inline unsigned char *append_uint32(unsigned char *cp, uint32_t i) {
    uint32_t j;

    if (i == 0) {
	*cp++ = '0';
	return cp;
    }

    if (i < 100)        goto b1;
    if (i < 10000)      goto b3;
    if (i < 1000000)    goto b5;
    if (i < 100000000)  goto b7;

    if ((j = i / 1000000000)) {*cp++ = j + '0'; i -= j*1000000000; goto x8;}
    if ((j = i / 100000000))  {*cp++ = j + '0'; i -= j*100000000;  goto x7;}
 b7:if ((j = i / 10000000))   {*cp++ = j + '0'; i -= j*10000000;   goto x6;}
    if ((j = i / 1000000))    {*cp++ = j + '0', i -= j*1000000;    goto x5;}
 b5:if ((j = i / 100000))     {*cp++ = j + '0', i -= j*100000;     goto x4;}
    if ((j = i / 10000))      {*cp++ = j + '0', i -= j*10000;      goto x3;}
 b3:if ((j = i / 1000))       {*cp++ = j + '0', i -= j*1000;       goto x2;}
    if ((j = i / 100))        {*cp++ = j + '0', i -= j*100;        goto x1;}
 b1:if ((j = i / 10))         {*cp++ = j + '0', i -= j*10;         goto x0;}
    if (i)                     *cp++ = i + '0';
    return cp;

 x8: *cp++ = i / 100000000 + '0', i %= 100000000;
 x7: *cp++ = i / 10000000  + '0', i %= 10000000;
 x6: *cp++ = i / 1000000   + '0', i %= 1000000;
 x5: *cp++ = i / 100000    + '0', i %= 100000;
 x4: *cp++ = i / 10000     + '0', i %= 10000;
 x3: *cp++ = i / 1000      + '0', i %= 1000;
 x2: *cp++ = i / 100       + '0', i %= 100;
 x1: *cp++ = i / 10        + '0', i %= 10;
 x0: *cp++ = i             + '0';

    return cp;
}